

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

size_t Imf_3_4::bytesPerDeepLineTable
                 (Header *header,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  int minY;
  Box2i *pBVar1;
  size_t sVar2;
  
  pBVar1 = Header::dataWindow(header);
  minY = (pBVar1->min).y;
  pBVar1 = Header::dataWindow(header);
  sVar2 = bytesPerDeepLineTable(header,minY,(pBVar1->max).y,base,xStride,yStride,bytesPerLine);
  return sVar2;
}

Assistant:

size_t
bytesPerDeepLineTable (
    const Header&   header,
    char*           base,
    int             xStride,
    int             yStride,
    vector<size_t>& bytesPerLine)
{
    return bytesPerDeepLineTable (
        header,
        header.dataWindow ().min.y,
        header.dataWindow ().max.y,
        base,
        xStride,
        yStride,
        bytesPerLine);
}